

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O2

bool __thiscall
llama_model_loader::load_all_data
          (llama_model_loader *this,ggml_context *ctx,llama_buf_map *bufs,llama_mlocks *lmlocks,
          llama_progress_callback progress_callback,void *progress_callback_user_data)

{
  llama_files *this_00;
  llama_mmaps *this_01;
  ushort uVar1;
  pointer ppVar2;
  ulong uVar3;
  ulong uVar4;
  ggml_backend_event *pgVar5;
  llama_mmap *this_02;
  pointer ppgVar6;
  pointer pfVar7;
  pointer ppgVar8;
  bool bVar9;
  char cVar10;
  undefined8 in_RAX;
  undefined4 *puVar11;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *this_03;
  char *pcVar12;
  llama_tensor_weight *plVar13;
  _func_int **__new_size;
  reference pvVar14;
  size_type sVar15;
  mapped_type *ppgVar16;
  reference pvVar17;
  void *pvVar18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var19;
  _Result<std::pair<ggml_tensor_*,_bool>_> *p_Var20;
  reference pvVar21;
  reference pvVar22;
  size_t last;
  long lVar23;
  long lVar24;
  long lVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  runtime_error *prVar28;
  undefined8 uVar29;
  _func_int **pp_Var30;
  future<std::pair<ggml_tensor_*,_bool>_> *future;
  pointer ppgVar31;
  pointer this_04;
  _State_baseV2 *__tmp;
  ulong uVar32;
  size_t sVar33;
  uint uVar34;
  ulong uVar35;
  pointer ppgVar36;
  _State_baseV2 *__tmp_1;
  pair<ggml_tensor_*,_bool> pVar37;
  __allocator_type __a2;
  ggml_backend_buffer *buf;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1a0;
  llama_model_loader *local_198;
  __allocator_type __a2_1;
  ggml_backend_dev_props props;
  ggml_backend_event *local_158;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_150 [2];
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_std::allocator<std::pair<const_unsigned_int,_ggml_backend_buffer_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_140;
  thread local_138;
  undefined4 local_12c;
  _func_int **local_128;
  llama_progress_callback local_120;
  vector<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_> events;
  mapped_type local_d8;
  __basic_future<std::pair<ggml_tensor_*,_bool>_> local_c8;
  vector<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
  validation_result;
  vector<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_> read_buf;
  vector<void_*,_std::allocator<void_*>_> host_ptrs;
  vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_> host_buffers;
  
  local_140 = &bufs->_M_h;
  local_120 = progress_callback;
  if (this->size_data == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model-loader.cpp"
               ,0x37a,"GGML_ASSERT(%s) failed","size_data != 0 && \"call init_mappings() first\"");
  }
  read_buf.super__Vector_base<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  read_buf.super__Vector_base<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  read_buf.super__Vector_base<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  validation_result.
  super__Vector_base<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  validation_result.
  super__Vector_base<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  validation_result.
  super__Vector_base<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  host_buffers.super__Vector_base<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  host_buffers.super__Vector_base<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  host_buffers.super__Vector_base<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  events.super__Vector_base<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  events.super__Vector_base<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  events.super__Vector_base<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  host_ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  host_ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  host_ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_12c = (undefined4)CONCAT71((int7)((ulong)in_RAX >> 8),1);
  local_198 = this;
  if ((this->use_mmap == false) && (this->check_tensors == false)) {
    props.name = (char *)((ulong)props.name & 0xffffffff00000000);
    sVar15 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_std::allocator<std::pair<const_unsigned_int,_ggml_backend_buffer_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::count(&bufs->_M_h,(key_type_conflict *)&props);
    if (sVar15 != 0) {
      buf = (ggml_backend_buffer *)((ulong)buf & 0xffffffff00000000);
      ppgVar16 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_std::allocator<std::pair<const_unsigned_int,_ggml_backend_buffer_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_std::allocator<std::pair<const_unsigned_int,_ggml_backend_buffer_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)local_140,(key_type *)&buf);
      if (*ppgVar16 != (mapped_type)0x0) {
        lVar23 = ggml_backend_buffer_get_type();
        lVar24 = ggml_backend_buft_get_device(lVar23);
        if (lVar24 == 0) {
          uVar29 = ggml_backend_buft_name(lVar23);
          lVar23 = 0;
          llama_log_internal(GGML_LOG_LEVEL_DEBUG,
                             "%s: no device found for buffer type %s for async uploads\n",
                             "load_all_data",uVar29);
          goto LAB_001f6456;
        }
        lVar25 = ggml_backend_dev_buffer_type(lVar24);
        if (lVar23 != lVar25) {
          uVar29 = ggml_backend_buft_name(lVar23);
          uVar26 = ggml_backend_dev_name(lVar24);
          lVar23 = 0;
          llama_log_internal(GGML_LOG_LEVEL_DEBUG,
                             "%s: buffer type %s is not the default buffer type for device %s for async uploads\n"
                             ,"load_all_data",uVar29,uVar26);
          goto LAB_001f6456;
        }
        ggml_backend_dev_get_props(lVar24,&props);
        if (((props.caps.async == true) && (props.caps.host_buffer == true)) &&
           (props.caps.events != false)) {
          lVar23 = ggml_backend_dev_host_buffer_type(lVar24);
          if (lVar23 == 0) {
            uVar29 = ggml_backend_dev_name(lVar24);
            pcVar12 = "%s: no host buffer type found for device %s\n";
          }
          else {
            lVar25 = 4;
            while (bVar9 = lVar25 != 0, lVar25 = lVar25 + -1, bVar9) {
              buf = (ggml_backend_buffer *)ggml_backend_buft_alloc_buffer(lVar23,0x100000);
              if (buf == (ggml_backend_buffer *)0x0) {
                uVar29 = ggml_backend_dev_name(lVar24);
                llama_log_internal(GGML_LOG_LEVEL_DEBUG,
                                   "%s: failed to allocate host buffer for async uploads for device %s\n"
                                   ,"load_all_data",uVar29);
                goto LAB_001f6454;
              }
              std::vector<ggml_backend_buffer*,std::allocator<ggml_backend_buffer*>>::
              emplace_back<ggml_backend_buffer*&>
                        ((vector<ggml_backend_buffer*,std::allocator<ggml_backend_buffer*>> *)
                         &host_buffers,&buf);
              local_158 = (ggml_backend_event *)ggml_backend_buffer_get_base(buf);
              std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                        ((vector<void*,std::allocator<void*>> *)&host_ptrs,&local_158);
              local_158 = (ggml_backend_event *)ggml_backend_event_new(lVar24);
              if (local_158 == (ggml_backend_event *)0x0) {
                uVar29 = ggml_backend_dev_name(lVar24);
                llama_log_internal(GGML_LOG_LEVEL_DEBUG,
                                   "%s: failed to create event for async uploads for device %s\n",
                                   "load_all_data",uVar29);
                goto LAB_001f6454;
              }
              std::vector<ggml_backend_event*,std::allocator<ggml_backend_event*>>::
              emplace_back<ggml_backend_event*&>
                        ((vector<ggml_backend_event*,std::allocator<ggml_backend_event*>> *)&events,
                         &local_158);
            }
            lVar23 = ggml_backend_dev_init(lVar24,0);
            if (lVar23 != 0) {
              uVar29 = ggml_backend_get_device(lVar23);
              uVar29 = ggml_backend_dev_name(uVar29);
              props.name = (char *)((ulong)props.name & 0xffffffff00000000);
              ppgVar16 = std::__detail::
                         _Map_base<unsigned_int,_std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_std::allocator<std::pair<const_unsigned_int,_ggml_backend_buffer_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_std::allocator<std::pair<const_unsigned_int,_ggml_backend_buffer_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)local_140,(key_type *)&props);
              uVar26 = ggml_backend_buffer_get_type(*ppgVar16);
              uVar26 = ggml_backend_buft_name(uVar26);
              uVar27 = ggml_backend_name(lVar23);
              llama_log_internal(GGML_LOG_LEVEL_DEBUG,
                                 "%s: using async uploads for device %s, buffer type %s, backend %s\n"
                                 ,"load_all_data",uVar29,uVar26,uVar27);
              local_12c = 0;
              goto LAB_001f6456;
            }
            uVar29 = ggml_backend_dev_name(lVar24);
            pcVar12 = "%s: failed to initialize backend for device %s for async uploads\n";
          }
        }
        else {
          uVar29 = ggml_backend_dev_name(lVar24);
          pcVar12 = "%s: device %s does not support async, host buffers or events\n";
        }
        llama_log_internal(GGML_LOG_LEVEL_DEBUG,pcVar12,"load_all_data",uVar29);
        goto LAB_001f6454;
      }
    }
    lVar23 = 0;
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: no buffer found for async uploads\n",
                       "load_all_data");
  }
  else {
LAB_001f6454:
    lVar23 = 0;
  }
LAB_001f6456:
  puVar11 = (undefined4 *)ggml_get_first_tensor(ctx);
  this_00 = &local_198->files;
  this_01 = &local_198->mappings;
  this_03 = &local_198->mmaps_used;
  uVar35 = 0;
  do {
    ppgVar6 = events.super__Vector_base<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppgVar36 = events.
               super__Vector_base<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (puVar11 == (undefined4 *)0x0) {
      for (; ppgVar8 = host_buffers.
                       super__Vector_base<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
          ppgVar31 = host_buffers.
                     super__Vector_base<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>
                     ._M_impl.super__Vector_impl_data._M_start, ppgVar36 != ppgVar6;
          ppgVar36 = ppgVar36 + 1) {
        pgVar5 = *ppgVar36;
        ggml_backend_event_synchronize(pgVar5);
        ggml_backend_event_free(pgVar5);
      }
      for (; ppgVar31 != ppgVar8; ppgVar31 = ppgVar31 + 1) {
        ggml_backend_buffer_free(*ppgVar31);
      }
      ggml_backend_free(lVar23);
      pfVar7 = validation_result.
               super__Vector_base<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar9 = false;
      for (this_04 = validation_result.
                     super__Vector_base<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_04 != pfVar7;
          this_04 = this_04 + 1) {
        pVar37 = std::future<std::pair<ggml_tensor_*,_bool>_>::get(this_04);
        if (((undefined1  [16])pVar37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          uVar29 = ggml_get_name(pVar37.first);
          bVar9 = true;
          llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: tensor \'%s\' has invalid data\n",
                             "load_all_data",uVar29);
        }
      }
      if (bVar9) {
        prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar28,"found tensors with invalid data");
        __cxa_throw(prVar28,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      bVar9 = true;
      if (local_198->size_data <= local_198->size_done) {
        if (local_198->use_mmap == true) {
          for (uVar34 = 0; uVar35 = (ulong)uVar34,
              uVar35 < (ulong)((long)(local_198->mappings).
                                     super__Vector_base<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_198->mappings).
                                     super__Vector_base<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3);
              uVar34 = uVar34 + 1) {
            pvVar22 = std::
                      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ::at(this_03,uVar35);
            pvVar14 = std::
                      vector<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
                      ::at(this_01,uVar35);
            llama_mmap::unmap_fragment
                      ((pvVar14->_M_t).
                       super___uniq_ptr_impl<llama_mmap,_std::default_delete<llama_mmap>_>._M_t.
                       super__Tuple_impl<0UL,_llama_mmap_*,_std::default_delete<llama_mmap>_>.
                       super__Head_base<0UL,_llama_mmap_*,_false>._M_head_impl,0,pvVar22->first);
            sVar33 = pvVar22->second;
            if (sVar33 != 0) {
              this_02 = (pvVar14->_M_t).
                        super___uniq_ptr_impl<llama_mmap,_std::default_delete<llama_mmap>_>._M_t.
                        super__Tuple_impl<0UL,_llama_mmap_*,_std::default_delete<llama_mmap>_>.
                        super__Head_base<0UL,_llama_mmap_*,_false>._M_head_impl;
              last = llama_mmap::size(this_02);
              llama_mmap::unmap_fragment(this_02,sVar33,last);
            }
          }
        }
        if (local_120 != (llama_progress_callback)0x0) {
          bVar9 = (*local_120)(1.0,progress_callback_user_data);
        }
      }
LAB_001f6e91:
      std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
                (&host_ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>);
      std::_Vector_base<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_>::~_Vector_base
                (&events.
                  super__Vector_base<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_>);
      std::_Vector_base<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>::
      ~_Vector_base(&host_buffers.
                     super__Vector_base<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>
                   );
      std::
      vector<std::future<std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::future<std::pair<ggml_tensor_*,_bool>_>_>_>
      ::~vector(&validation_result);
      std::_Vector_base<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>::
      ~_Vector_base(&read_buf.
                     super__Vector_base<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>
                   );
      return bVar9;
    }
    pcVar12 = (char *)ggml_get_name(puVar11);
    plVar13 = get_weight(local_198,pcVar12);
    if (plVar13 != (llama_tensor_weight *)0x0) {
      if ((local_120 != (llama_progress_callback)0x0) &&
         (bVar9 = (*local_120)((float)local_198->size_done / (float)local_198->size_data,
                               progress_callback_user_data), !bVar9)) {
        bVar9 = false;
        goto LAB_001f6e91;
      }
      __new_size = (_func_int **)ggml_nbytes(puVar11);
      if (local_198->use_mmap == true) {
        pvVar14 = std::
                  vector<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
                  ::at(this_01,(ulong)plVar13->idx);
        props.name = (char *)CONCAT44(props.name._4_4_,(uint)plVar13->idx);
        sVar15 = std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_std::allocator<std::pair<const_unsigned_int,_ggml_backend_buffer_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::count(local_140,(key_type_conflict *)&props);
        if (sVar15 == 0) {
          local_d8 = (mapped_type)0x0;
        }
        else {
          props.name = (char *)CONCAT44(props.name._4_4_,(uint)plVar13->idx);
          ppgVar16 = std::__detail::
                     _Map_base<unsigned_int,_std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_std::allocator<std::pair<const_unsigned_int,_ggml_backend_buffer_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_ggml_backend_buffer_*>,_std::allocator<std::pair<const_unsigned_int,_ggml_backend_buffer_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)local_140,(key_type *)&props);
          local_d8 = *ppgVar16;
        }
        pvVar18 = llama_mmap::addr((pvVar14->_M_t).
                                   super___uniq_ptr_impl<llama_mmap,_std::default_delete<llama_mmap>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_llama_mmap_*,_std::default_delete<llama_mmap>_>
                                   .super__Head_base<0UL,_llama_mmap_*,_false>._M_head_impl);
        pp_Var30 = (_func_int **)((long)pvVar18 + plVar13->offs);
        if (local_198->check_tensors == true) {
          buf = (ggml_backend_buffer *)0x0;
          _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_128 = pp_Var30;
          p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
          props.name = (char *)&__a2;
          p_Var19->_M_use_count = 1;
          p_Var19->_M_weak_count = 1;
          p_Var19->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002cdd60;
          p_Var19[1]._M_use_count = 0;
          p_Var19[1]._M_weak_count = 0;
          *(undefined4 *)&p_Var19[2]._vptr__Sp_counted_base = 0;
          *(char *)((long)&p_Var19[2]._vptr__Sp_counted_base + 4) = '\0';
          p_Var19[2]._M_use_count = 0;
          p_Var19[3]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var19[3]._M_use_count = 0;
          p_Var19[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_002cddb0;
          props.description = (char *)p_Var19;
          p_Var20 = (_Result<std::pair<ggml_tensor_*,_bool>_> *)operator_new(0x28);
          std::__future_base::_Result<std::pair<ggml_tensor_*,_bool>_>::_Result(p_Var20);
          p_Var19[4]._vptr__Sp_counted_base = (_func_int **)p_Var20;
          *(undefined4 **)&p_Var19[4]._M_use_count = puVar11;
          p_Var19[5]._vptr__Sp_counted_base = local_128;
          *(_func_int ***)&p_Var19[5]._M_use_count = __new_size;
          local_138._M_id._M_thread = (id)0;
          ___a2_1 = (long *)operator_new(0x20);
          *___a2_1 = (long)&PTR___State_002cde08;
          ___a2_1[1] = (long)(p_Var19 + 1);
          ___a2_1[2] = (long)std::__future_base::
                             _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model-loader.cpp:1008:79)>_>,_std::pair<ggml_tensor_*,_bool>_>
                             ::_M_run;
          ___a2_1[3] = 0;
          std::thread::_M_start_thread(&local_138,&__a2_1,0);
          if (___a2_1 != (long *)0x0) {
            (**(code **)(*___a2_1 + 8))();
          }
          std::thread::operator=((thread *)(p_Var19 + 3),&local_138);
          std::thread::~thread(&local_138);
          props.description = (char *)0x0;
          std::
          __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model-loader.cpp:1008:79)>_>,_std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model-loader.cpp:1008:79)>_>,_std::pair<ggml_tensor_*,_bool>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
          ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_llama_model_loader_cpp:1008:79)>_>,_std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_llama_model_loader_cpp:1008:79)>_>,_std::pair<ggml_tensor_*,_bool>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                              *)&props);
          local_158 = (ggml_backend_event *)0x0;
          a_Stack_150[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          props.name = (char *)buf;
          props.description = (char *)_Stack_1a0._M_pi;
          buf = (ggml_backend_buffer *)(p_Var19 + 1);
          _Stack_1a0._M_pi = p_Var19;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&props.description);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_150);
          if (buf == (ggml_backend_buffer *)0x0) {
            p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
            props.name = (char *)&__a2_1;
            p_Var19->_M_use_count = 1;
            p_Var19->_M_weak_count = 1;
            p_Var19->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002cde48;
            p_Var19[1]._M_use_count = 0;
            p_Var19[1]._M_weak_count = 0;
            *(undefined4 *)&p_Var19[2]._vptr__Sp_counted_base = 0;
            *(char *)((long)&p_Var19[2]._vptr__Sp_counted_base + 4) = '\0';
            p_Var19[2]._M_use_count = 0;
            p_Var19[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_002cde98;
            props.description = (char *)p_Var19;
            p_Var20 = (_Result<std::pair<ggml_tensor_*,_bool>_> *)operator_new(0x28);
            std::__future_base::_Result<std::pair<ggml_tensor_*,_bool>_>::_Result(p_Var20);
            p_Var19[3]._vptr__Sp_counted_base = (_func_int **)p_Var20;
            *(undefined4 **)&p_Var19[3]._M_use_count = puVar11;
            p_Var19[4]._vptr__Sp_counted_base = local_128;
            *(_func_int ***)&p_Var19[4]._M_use_count = __new_size;
            props.description = (char *)0x0;
            std::
            __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model-loader.cpp:1008:79)>_>,_std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model-loader.cpp:1008:79)>_>,_std::pair<ggml_tensor_*,_bool>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
            ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_llama_model_loader_cpp:1008:79)>_>,_std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_llama_model_loader_cpp:1008:79)>_>,_std::pair<ggml_tensor_*,_bool>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                                *)&props);
            local_158 = (ggml_backend_event *)0x0;
            a_Stack_150[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            props.name = (char *)buf;
            props.description = (char *)_Stack_1a0._M_pi;
            buf = (ggml_backend_buffer *)(p_Var19 + 1);
            _Stack_1a0._M_pi = p_Var19;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&props.description);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_150);
          }
          std::__basic_future<std::pair<ggml_tensor_*,_bool>_>::__basic_future
                    (&local_c8,(__state_type *)&buf);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1a0);
          std::
          vector<std::future<std::pair<ggml_tensor*,bool>>,std::allocator<std::future<std::pair<ggml_tensor*,bool>>>>
          ::emplace_back<std::future<std::pair<ggml_tensor*,bool>>>
                    ((vector<std::future<std::pair<ggml_tensor*,bool>>,std::allocator<std::future<std::pair<ggml_tensor*,bool>>>>
                      *)&validation_result,(future<std::pair<ggml_tensor_*,_bool>_> *)&local_c8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_c8._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          pp_Var30 = local_128;
        }
        if (local_d8 == (mapped_type)0x0) {
          if (*(long *)(puVar11 + 0x3e) == 0) {
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model-loader.cpp"
                       ,0x3f5,"GGML_ASSERT(%s) failed","buf_mmap || cur->data");
          }
        }
        else if (*(long *)(puVar11 + 0x3e) == 0) {
          ggml_backend_tensor_alloc(local_d8,puVar11);
          if (lmlocks != (llama_mlocks *)0x0) {
            pvVar21 = std::
                      vector<std::unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_>,_std::allocator<std::unique_ptr<llama_mlock,_std::default_delete<llama_mlock>_>_>_>
                      ::at(lmlocks,(ulong)plVar13->idx);
            llama_mlock::grow_to
                      ((pvVar21->_M_t).
                       super___uniq_ptr_impl<llama_mlock,_std::default_delete<llama_mlock>_>._M_t.
                       super__Tuple_impl<0UL,_llama_mlock_*,_std::default_delete<llama_mlock>_>.
                       super__Head_base<0UL,_llama_mlock_*,_false>._M_head_impl,
                       plVar13->offs + (long)__new_size);
          }
          uVar1 = plVar13->idx;
          ppVar2 = (this_03->
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar3 = plVar13->offs;
          uVar4 = ppVar2[uVar1].second;
          uVar32 = ppVar2[uVar1].first;
          if (uVar3 < ppVar2[uVar1].first) {
            uVar32 = uVar3;
          }
          ppVar2[uVar1].first = uVar32;
          uVar32 = (long)__new_size + uVar3;
          if ((long)__new_size + uVar3 < uVar4) {
            uVar32 = uVar4;
          }
          ppVar2[uVar1].second = uVar32;
          goto LAB_001f6c61;
        }
        ggml_backend_tensor_set(puVar11,pp_Var30,0,__new_size);
      }
      else {
        pvVar17 = std::
                  vector<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
                  ::at(this_00,(ulong)plVar13->idx);
        cVar10 = ggml_backend_buffer_is_host(*(undefined8 *)(puVar11 + 2));
        if (cVar10 == '\0') {
          if ((char)local_12c == '\0') {
            llama_file::seek((pvVar17->_M_t).
                             super___uniq_ptr_impl<llama_file,_std::default_delete<llama_file>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_llama_file_*,_std::default_delete<llama_file>_>.
                             super__Head_base<0UL,_llama_file_*,_false>._M_head_impl,plVar13->offs,0
                            );
            for (pp_Var30 = (_func_int **)0x0; sVar33 = (long)__new_size - (long)pp_Var30,
                pp_Var30 <= __new_size && sVar33 != 0;
                pp_Var30 = (_func_int **)((long)pp_Var30 + sVar33)) {
              if (0xfffff < sVar33) {
                sVar33 = 0x100000;
              }
              ggml_backend_event_synchronize
                        (events.
                         super__Vector_base<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar35]);
              llama_file::read_raw
                        ((pvVar17->_M_t).
                         super___uniq_ptr_impl<llama_file,_std::default_delete<llama_file>_>._M_t.
                         super__Tuple_impl<0UL,_llama_file_*,_std::default_delete<llama_file>_>.
                         super__Head_base<0UL,_llama_file_*,_false>._M_head_impl,
                         host_ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar35],sVar33);
              ggml_backend_tensor_set_async
                        (lVar23,puVar11,
                         host_ptrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar35],pp_Var30,sVar33);
              ggml_backend_event_record
                        (events.
                         super__Vector_base<ggml_backend_event_*,_std::allocator<ggml_backend_event_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar35],lVar23);
              uVar35 = (ulong)((int)uVar35 + 1U & 3);
            }
          }
          else {
            std::vector<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>::resize
                      (&read_buf,(size_type)__new_size);
            llama_file::seek((pvVar17->_M_t).
                             super___uniq_ptr_impl<llama_file,_std::default_delete<llama_file>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_llama_file_*,_std::default_delete<llama_file>_>.
                             super__Head_base<0UL,_llama_file_*,_false>._M_head_impl,plVar13->offs,0
                            );
            llama_file::read_raw
                      ((pvVar17->_M_t).
                       super___uniq_ptr_impl<llama_file,_std::default_delete<llama_file>_>._M_t.
                       super__Tuple_impl<0UL,_llama_file_*,_std::default_delete<llama_file>_>.
                       super__Head_base<0UL,_llama_file_*,_false>._M_head_impl,
                       read_buf.
                       super__Vector_base<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,(size_t)__new_size);
            ggml_backend_tensor_set
                      (puVar11,read_buf.
                               super__Vector_base<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,0,__new_size);
            if ((local_198->check_tensors == true) &&
               (cVar10 = ggml_validate_row_data
                                   (*puVar11,read_buf.
                                             super__Vector_base<no_init<unsigned_char>,_std::allocator<no_init<unsigned_char>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start,__new_size),
               cVar10 == '\0')) {
              prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
              uVar29 = ggml_get_name(puVar11);
              format_abi_cxx11_((string *)&props,"tensor \'%s\' has invalid data",uVar29);
              std::runtime_error::runtime_error(prVar28,(string *)&props);
              __cxa_throw(prVar28,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
          }
        }
        else {
          llama_file::seek((pvVar17->_M_t).
                           super___uniq_ptr_impl<llama_file,_std::default_delete<llama_file>_>._M_t.
                           super__Tuple_impl<0UL,_llama_file_*,_std::default_delete<llama_file>_>.
                           super__Head_base<0UL,_llama_file_*,_false>._M_head_impl,plVar13->offs,0);
          llama_file::read_raw
                    ((pvVar17->_M_t).
                     super___uniq_ptr_impl<llama_file,_std::default_delete<llama_file>_>._M_t.
                     super__Tuple_impl<0UL,_llama_file_*,_std::default_delete<llama_file>_>.
                     super__Head_base<0UL,_llama_file_*,_false>._M_head_impl,
                     *(void **)(puVar11 + 0x3e),(size_t)__new_size);
          if (local_198->check_tensors == true) {
            buf = (ggml_backend_buffer *)0x0;
            _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
            props.name = (char *)&__a2;
            p_Var19->_M_use_count = 1;
            p_Var19->_M_weak_count = 1;
            p_Var19->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002cdee0;
            p_Var19[1]._M_use_count = 0;
            p_Var19[1]._M_weak_count = 0;
            *(undefined4 *)&p_Var19[2]._vptr__Sp_counted_base = 0;
            *(char *)((long)&p_Var19[2]._vptr__Sp_counted_base + 4) = '\0';
            p_Var19[2]._M_use_count = 0;
            p_Var19[3]._vptr__Sp_counted_base = (_func_int **)0x0;
            p_Var19[3]._M_use_count = 0;
            p_Var19[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_002cdf30;
            props.description = (char *)p_Var19;
            p_Var20 = (_Result<std::pair<ggml_tensor_*,_bool>_> *)operator_new(0x28);
            std::__future_base::_Result<std::pair<ggml_tensor_*,_bool>_>::_Result(p_Var20);
            p_Var19[4]._vptr__Sp_counted_base = (_func_int **)p_Var20;
            *(undefined4 **)&p_Var19[4]._M_use_count = puVar11;
            p_Var19[5]._vptr__Sp_counted_base = __new_size;
            local_138._M_id._M_thread = (id)0;
            ___a2_1 = (long *)operator_new(0x20);
            *___a2_1 = (long)&PTR___State_002cdf88;
            ___a2_1[1] = (long)(p_Var19 + 1);
            ___a2_1[2] = (long)std::__future_base::
                               _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model-loader.cpp:1033:83)>_>,_std::pair<ggml_tensor_*,_bool>_>
                               ::_M_run;
            ___a2_1[3] = 0;
            std::thread::_M_start_thread(&local_138,&__a2_1,0);
            if (___a2_1 != (long *)0x0) {
              (**(code **)(*___a2_1 + 8))();
            }
            std::thread::operator=((thread *)(p_Var19 + 3),&local_138);
            std::thread::~thread(&local_138);
            props.description = (char *)0x0;
            std::
            __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model-loader.cpp:1033:83)>_>,_std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model-loader.cpp:1033:83)>_>,_std::pair<ggml_tensor_*,_bool>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
            ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_llama_model_loader_cpp:1033:83)>_>,_std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_llama_model_loader_cpp:1033:83)>_>,_std::pair<ggml_tensor_*,_bool>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                                *)&props);
            local_158 = (ggml_backend_event *)0x0;
            a_Stack_150[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            props.name = (char *)buf;
            props.description = (char *)_Stack_1a0._M_pi;
            buf = (ggml_backend_buffer *)(p_Var19 + 1);
            _Stack_1a0._M_pi = p_Var19;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&props.description);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_150);
            if (buf == (ggml_backend_buffer *)0x0) {
              p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
              props.name = (char *)&__a2_1;
              p_Var19->_M_use_count = 1;
              p_Var19->_M_weak_count = 1;
              p_Var19->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002cdfc8
              ;
              p_Var19[1]._M_use_count = 0;
              p_Var19[1]._M_weak_count = 0;
              *(undefined4 *)&p_Var19[2]._vptr__Sp_counted_base = 0;
              *(char *)((long)&p_Var19[2]._vptr__Sp_counted_base + 4) = '\0';
              p_Var19[2]._M_use_count = 0;
              p_Var19[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_002ce018;
              props.description = (char *)p_Var19;
              p_Var20 = (_Result<std::pair<ggml_tensor_*,_bool>_> *)operator_new(0x28);
              std::__future_base::_Result<std::pair<ggml_tensor_*,_bool>_>::_Result(p_Var20);
              p_Var19[3]._vptr__Sp_counted_base = (_func_int **)p_Var20;
              *(undefined4 **)&p_Var19[3]._M_use_count = puVar11;
              p_Var19[4]._vptr__Sp_counted_base = __new_size;
              props.description = (char *)0x0;
              std::
              __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model-loader.cpp:1033:83)>_>,_std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model-loader.cpp:1033:83)>_>,_std::pair<ggml_tensor_*,_bool>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
              ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_llama_model_loader_cpp:1033:83)>_>,_std::pair<ggml_tensor_*,_bool>_>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_llama_model_loader_cpp:1033:83)>_>,_std::pair<ggml_tensor_*,_bool>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                                  *)&props);
              local_158 = (ggml_backend_event *)0x0;
              a_Stack_150[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              props.name = (char *)buf;
              props.description = (char *)_Stack_1a0._M_pi;
              buf = (ggml_backend_buffer *)(p_Var19 + 1);
              _Stack_1a0._M_pi = p_Var19;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&props.description);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_150);
            }
            std::__basic_future<std::pair<ggml_tensor_*,_bool>_>::__basic_future
                      (&local_c8,(__state_type *)&buf);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1a0);
            std::
            vector<std::future<std::pair<ggml_tensor*,bool>>,std::allocator<std::future<std::pair<ggml_tensor*,bool>>>>
            ::emplace_back<std::future<std::pair<ggml_tensor*,bool>>>
                      ((vector<std::future<std::pair<ggml_tensor*,bool>>,std::allocator<std::future<std::pair<ggml_tensor*,bool>>>>
                        *)&validation_result,(future<std::pair<ggml_tensor_*,_bool>_> *)&local_c8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_c8._M_state.
                        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
          }
        }
      }
LAB_001f6c61:
      local_198->size_done = local_198->size_done + (long)__new_size;
    }
    puVar11 = (undefined4 *)ggml_get_next_tensor(ctx,puVar11);
  } while( true );
}

Assistant:

bool llama_model_loader::load_all_data(
        struct ggml_context * ctx,
        llama_buf_map & bufs,
        llama_mlocks * lmlocks,
        llama_progress_callback progress_callback,
        void * progress_callback_user_data) {
    GGML_ASSERT(size_data != 0 && "call init_mappings() first");

    std::vector<no_init<uint8_t>> read_buf;
    std::vector<std::future<std::pair<ggml_tensor *, bool>>> validation_result;

    // 4 staging buffers for async uploads, each sized 1MB seems to be a good default for single NVMe drives.
    // NVMe raid configurations might require more / larger buffers.
    constexpr size_t n_buffers = 4;
    constexpr size_t buffer_size = 1 * 1024 * 1024; // 1MB

    std::vector<ggml_backend_buffer_t> host_buffers;
    std::vector<ggml_backend_event_t> events;
    std::vector<void *> host_ptrs;
    size_t buffer_idx = 0; // buffer to use for async loads
    ggml_backend_t upload_backend = [&](const char * func) -> ggml_backend_t {
        if (use_mmap || check_tensors) {
            return nullptr;
        }
        // When not using mmaped io use async uploads from pinned memory to GPU memory.
        // First determine if the backend supports the necessary features for async uploads.
        auto * buf = bufs.count(0) ? bufs.at(0) : nullptr;
        if (!buf) {
            LLAMA_LOG_DEBUG("%s: no buffer found for async uploads\n", func);
            return nullptr;
        }

        auto * buft = ggml_backend_buffer_get_type(buf);
        auto * dev = ggml_backend_buft_get_device(buft);
        if (!dev) {
            LLAMA_LOG_DEBUG("%s: no device found for buffer type %s for async uploads\n", func,
                ggml_backend_buft_name(buft));
            return nullptr;
        }

        if (buft != ggml_backend_dev_buffer_type(dev)) {
            LLAMA_LOG_DEBUG("%s: buffer type %s is not the default buffer type for device %s for async uploads\n", func,
                ggml_backend_buft_name(buft), ggml_backend_dev_name(dev));
            return nullptr;
        }

        ggml_backend_dev_props props;
        ggml_backend_dev_get_props(dev, &props);
        if (!props.caps.async || !props.caps.host_buffer || !props.caps.events) {
            LLAMA_LOG_DEBUG("%s: device %s does not support async, host buffers or events\n", func,
                ggml_backend_dev_name(dev));
            return nullptr;
        }

        auto * host_buft = ggml_backend_dev_host_buffer_type(dev);
        if (!host_buft) {
            LLAMA_LOG_DEBUG("%s: no host buffer type found for device %s\n", func,
                ggml_backend_dev_name(dev));
            return nullptr;
        }

        // If the backend is supported, create pinned memory buffers and events for synchronisation.
        for (size_t idx = 0; idx < n_buffers; ++idx) {
            auto * buf = ggml_backend_buft_alloc_buffer(host_buft, buffer_size);
            if (!buf) {
                LLAMA_LOG_DEBUG("%s: failed to allocate host buffer for async uploads for device %s\n", func,
                    ggml_backend_dev_name(dev));
                return nullptr;
            }

            host_buffers.emplace_back(buf);
            host_ptrs.emplace_back(ggml_backend_buffer_get_base(buf));

            auto * event = ggml_backend_event_new(dev);
            if (!event) {
                LLAMA_LOG_DEBUG("%s: failed to create event for async uploads for device %s\n", func,
                    ggml_backend_dev_name(dev));
                return nullptr;
            }

            events.emplace_back(event);
        }

        ggml_backend_t backend = ggml_backend_dev_init(dev, nullptr);
        if (!backend) {
            LLAMA_LOG_DEBUG("%s: failed to initialize backend for device %s for async uploads\n", func,
                ggml_backend_dev_name(dev));
            return nullptr;
        }

        return backend;
    }(__func__);

    if (upload_backend) {
        LLAMA_LOG_DEBUG("%s: using async uploads for device %s, buffer type %s, backend %s\n", __func__,
            ggml_backend_dev_name(ggml_backend_get_device(upload_backend)),
            ggml_backend_buft_name(ggml_backend_buffer_get_type(bufs.at(0))),
            ggml_backend_name(upload_backend));
    }

    for (struct ggml_tensor * cur = ggml_get_first_tensor(ctx); cur != NULL; cur = ggml_get_next_tensor(ctx, cur)) {
        const auto * weight = get_weight(ggml_get_name(cur));
        if (weight == nullptr) {
            // this can happen with split experts models
            continue;
        }

        if (progress_callback) {
            if (!progress_callback((float) size_done / size_data, progress_callback_user_data)) {
                return false;
            }
        }

        size_t n_size = ggml_nbytes(cur);

        if (use_mmap) {
            const auto & mapping = mappings.at(weight->idx);
            ggml_backend_buffer_t buf_mmap = nullptr;
            if (bufs.count(weight->idx)) {
                buf_mmap = bufs.at(weight->idx);
            }
            uint8_t * data = (uint8_t *) mapping->addr() + weight->offs;

            if (check_tensors) {
                validation_result.emplace_back(std::async(std::launch::async, [cur, data, n_size] {
                    return std::make_pair(cur, ggml_validate_row_data(cur->type, data, n_size));
                }));
            }

            GGML_ASSERT(buf_mmap || cur->data); // either we have a buffer to allocate the tensor in, or it is already allocated
            if (buf_mmap && cur->data == nullptr) {
                ggml_backend_tensor_alloc(buf_mmap, cur, data);
                if (lmlocks) {
                    const auto & lmlock = lmlocks->at(weight->idx);
                    lmlock->grow_to(weight->offs + n_size);
                }

                auto & mmap_used = mmaps_used[weight->idx];
                mmap_used.first  = std::min(mmap_used.first,  weight->offs);
                mmap_used.second = std::max(mmap_used.second, weight->offs + n_size);
            } else {
                ggml_backend_tensor_set(cur, data, 0, n_size);
            }
        } else {
            const auto & file = files.at(weight->idx);
            if (ggml_backend_buffer_is_host(cur->buffer)) {
                file->seek(weight->offs, SEEK_SET);
                file->read_raw(cur->data, n_size);
                if (check_tensors) {
                    validation_result.emplace_back(std::async(std::launch::async, [cur, n_size] {
                        return std::make_pair(cur, ggml_validate_row_data(cur->type, cur->data, n_size));
                    }));
                }
            } else {
                // If upload_backend is valid load the tensor in chunks to pinned memory and upload the buffers asynchronously to the GPU.
                if (upload_backend) {
                    file->seek(weight->offs, SEEK_SET);

                    size_t bytes_read = 0;

                    while (bytes_read < n_size) {
                        size_t read_iteration = std::min<size_t>(buffer_size, n_size - bytes_read);

                        ggml_backend_event_synchronize(events[buffer_idx]);
                        file->read_raw(host_ptrs[buffer_idx], read_iteration);
                        ggml_backend_tensor_set_async(upload_backend, cur, host_ptrs[buffer_idx], bytes_read, read_iteration);
                        ggml_backend_event_record(events[buffer_idx], upload_backend);

                        bytes_read += read_iteration;
                        ++buffer_idx;
                        buffer_idx %= n_buffers;
                    }
                } else {
                    read_buf.resize(n_size);
                    file->seek(weight->offs, SEEK_SET);
                    file->read_raw(read_buf.data(), n_size);
                    ggml_backend_tensor_set(cur, read_buf.data(), 0, n_size);
                    if (check_tensors && !ggml_validate_row_data(cur->type, read_buf.data(), n_size)) {
                        throw std::runtime_error(format("tensor '%s' has invalid data", ggml_get_name(cur)));
                    }
                }
            }
        }

        size_done += n_size;
    }

    // free temporary resources used for async uploads
    for (auto * event : events) {
        ggml_backend_event_synchronize(event);
        ggml_backend_event_free(event);
    }
    for (auto * buf : host_buffers) {
        ggml_backend_buffer_free(buf);
    }
    ggml_backend_free(upload_backend);

    // check validation results
    bool validation_failed = false;
    for (auto & future : validation_result) {
        auto result = future.get();
        if (!result.second) {
            LLAMA_LOG_ERROR("%s: tensor '%s' has invalid data\n", __func__, ggml_get_name(result.first));
            validation_failed = true;
        }
    }
    if (validation_failed) {
        throw std::runtime_error("found tensors with invalid data");
    }

    // check if this is the last call and do final cleanup
    if (size_done >= size_data) {
        // unmap offloaded tensors and metadata
        if (use_mmap) {
            for (uint32_t idx = 0; idx < mappings.size(); idx++) {
                const auto & mmap_used = mmaps_used.at(idx);
                auto & mapping = mappings.at(idx);
                mapping->unmap_fragment(0, mmap_used.first);
                if (mmap_used.second != 0) {
                    mapping->unmap_fragment(mmap_used.second, mapping->size());
                }
            }
        }
        if (progress_callback) {
            // Even though the model is done loading, we still honor
            // cancellation since we need to free allocations.
            return progress_callback(1.0f, progress_callback_user_data);
        }
    }

    return true;
}